

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void MirrorRow_C(uint8_t *src,uint8_t *dst,int width)

{
  int x;
  int width_local;
  uint8_t *dst_local;
  uint8_t *src_local;
  
  src_local = src + (width + -1);
  for (x = 0; x < width + -1; x = x + 2) {
    dst[x] = *src_local;
    dst[x + 1] = src_local[-1];
    src_local = src_local + -2;
  }
  if ((width & 1U) != 0) {
    dst[width + -1] = *src_local;
  }
  return;
}

Assistant:

void MirrorRow_C(const uint8_t* src, uint8_t* dst, int width) {
  int x;
  src += width - 1;
  for (x = 0; x < width - 1; x += 2) {
    dst[x] = src[0];
    dst[x + 1] = src[-1];
    src -= 2;
  }
  if (width & 1) {
    dst[width - 1] = src[0];
  }
}